

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

int mario::sockets::close(int __fd)

{
  int iVar1;
  int extraout_EAX;
  Writer *this;
  Writer local_88;
  int local_c;
  int sockfd_local;
  
  local_c = __fd;
  iVar1 = ::close(__fd);
  if (iVar1 < 0) {
    el::base::Writer::Writer
              (&local_88,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/SocketsOps.cpp"
               ,0x41,"void mario::sockets::close(int)",NormalLog,0);
    this = el::base::Writer::construct(&local_88,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<(this,(char (*) [15])"sockets::close");
    el::base::Writer::~Writer(&local_88);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void sockets::close(int sockfd) {
    if (::close(sockfd) < 0) {
        LOG(FATAL) << "sockets::close";
    }
}